

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBooleanStateQueryTests.cpp
# Opt level: O0

char * deqp::gles31::Functional::anon_unknown_1::getVerifierSuffix(QueryType type)

{
  char *pcStack_10;
  QueryType type_local;
  
  if (type == QUERY_PROGRAM_INTEGER || type == QUERY_PROGRAM_INTEGER_VEC3) {
    pcStack_10 = "get_programiv";
  }
  else {
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

static const char* getVerifierSuffix (QueryType type)
{
	switch (type)
	{
		case QUERY_ISENABLED:	return "isenabled";
		case QUERY_BOOLEAN:		return "getboolean";
		case QUERY_INTEGER:		return "getinteger";
		case QUERY_INTEGER64:	return "getinteger64";
		case QUERY_FLOAT:		return "getfloat";
		default:
			DE_ASSERT(DE_FALSE);
			return DE_NULL;
	}
}